

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  undefined4 uVar1;
  smb_nt_create_response *psVar2;
  smb_nt_create_response *smb_m;
  void *msg;
  unsigned_short local_48;
  ushort local_46;
  CURLcode result;
  unsigned_short off;
  unsigned_short len;
  smb_req_state next_state;
  smb_conn *smbc;
  smb_header *h;
  smb_request *req;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  req = (smb_request *)data->conn;
  h = (smb_header *)(data->req).p.imap;
  _off = &((connectdata *)req)->proto;
  result = CURLE_COULDNT_CONNECT;
  smb_m = (smb_nt_create_response *)0x0;
  conn = (connectdata *)done;
  done_local = (_Bool *)data;
  if (((IMAP *)h)->transfer == PPTRANSFER_BODY) {
    msg._4_4_ = smb_send_tree_connect(data);
    if (msg._4_4_ != CURLE_OK) {
      Curl_conncontrol((connectdata *)req,1);
      return msg._4_4_;
    }
    request_state((Curl_easy *)done_local,SMB_TREE_CONNECT);
  }
  msg._4_4_ = smb_send_and_recv((Curl_easy *)done_local,&smb_m);
  psVar2 = smb_m;
  if ((msg._4_4_ != CURLE_OK) && (msg._4_4_ != CURLE_AGAIN)) {
    Curl_conncontrol((connectdata *)req,1);
    return msg._4_4_;
  }
  if (smb_m == (smb_nt_create_response *)0x0) {
    return CURLE_OK;
  }
  smbc = (smb_conn *)smb_m;
  uVar1._0_1_ = h->nbt_type;
  uVar1._1_1_ = h->nbt_flags;
  uVar1._2_2_ = h->nbt_length;
  switch(uVar1) {
  case 1:
    if ((smb_m->h).status == 0) {
      h->pid_high = (smb_m->h).tid;
      result = CURLE_FAILED_INIT;
    }
    else {
      h->signature[2] = 'N';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      if ((smb_m->h).status == 0x50001) {
        h->signature[2] = '\t';
        h->signature[3] = '\0';
        h->signature[4] = '\0';
        h->signature[5] = '\0';
      }
    }
    break;
  case 2:
    if (((smb_m->h).status == 0) && (99 < (ulong)(_off->ftpc).pp.response_time)) {
      *(unsigned_short *)h->signature = smb_m->fid;
      done_local[0x138] = false;
      done_local[0x139] = false;
      done_local[0x13a] = false;
      done_local[0x13b] = false;
      done_local[0x13c] = false;
      done_local[0x13d] = false;
      done_local[0x13e] = false;
      done_local[0x13f] = false;
      if ((*(ulong *)(done_local + 0xa92) >> 0x1a & 1) == 0) {
        *(curl_off_t *)(done_local + 0xd0) = smb_m->end_of_file;
        if (*(long *)(done_local + 0xd0) < 0) {
          h->signature[2] = '\b';
          h->signature[3] = '\0';
          h->signature[4] = '\0';
          h->signature[5] = '\0';
          result = CURLE_COULDNT_RESOLVE_PROXY;
        }
        else {
          Curl_pgrsSetDownloadSize((Curl_easy *)done_local,*(curl_off_t *)(done_local + 0xd0));
          if ((*(ulong *)(done_local + 0xa92) >> 5 & 1) != 0) {
            get_posix_time((time_t *)(done_local + 0x1368),psVar2->last_change_time);
          }
          result = CURLE_URL_MALFORMAT;
        }
      }
      else {
        *(undefined8 *)(done_local + 0xd0) = *(undefined8 *)(done_local + 0x1168);
        Curl_pgrsSetUploadSize((Curl_easy *)done_local,*(curl_off_t *)(done_local + 0xd0));
        result = CURLE_NOT_BUILT_IN;
      }
    }
    else {
      h->signature[2] = 'N';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      if ((smb_m->h).status == 0x50001) {
        h->signature[2] = '\t';
        h->signature[3] = '\0';
        h->signature[4] = '\0';
        h->signature[5] = '\0';
      }
      result = CURLE_COULDNT_RESOLVE_HOST;
    }
    break;
  case 3:
    if (((smb_m->h).status == 0) && (0x31 < (ulong)(_off->ftpc).pp.response_time)) {
      local_46 = Curl_read16_le((uchar *)((long)&smb_m->create_disposition + 3));
      local_48 = Curl_read16_le((uchar *)((long)&smb_m->create_time + 1));
      if (local_46 != 0) {
        if ((ulong)(_off->ftpc).pp.response_time < (ulong)local_48 + 4 + (ulong)local_46) {
          Curl_failf((Curl_easy *)done_local,"Invalid input packet");
          msg._4_4_ = CURLE_RECV_ERROR;
        }
        else {
          msg._4_4_ = Curl_client_write((Curl_easy *)done_local,1,
                                        (char *)((smb_m->h).magic + (int)(uint)local_48),
                                        (ulong)local_46);
        }
        if (msg._4_4_ != CURLE_OK) {
          *(CURLcode *)(h->signature + 2) = msg._4_4_;
          result = CURLE_COULDNT_RESOLVE_PROXY;
          break;
        }
      }
      *(ulong *)(done_local + 0xe0) = (ulong)local_46 + *(long *)(done_local + 0xe0);
      *(ulong *)(done_local + 0x138) = (ulong)local_46 + *(long *)(done_local + 0x138);
      Curl_pgrsSetDownloadCounter((Curl_easy *)done_local,*(curl_off_t *)(done_local + 0xe0));
      result = CURLE_URL_MALFORMAT;
      if (local_46 < 0x8000) {
        result = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    else {
      h->signature[2] = '8';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      result = CURLE_COULDNT_RESOLVE_PROXY;
    }
    break;
  case 4:
    if (((smb_m->h).status == 0) && (0x29 < (ulong)(_off->ftpc).pp.response_time)) {
      local_46 = Curl_read16_le(&smb_m->op_lock_level);
      *(ulong *)(done_local + 0xe0) = (ulong)local_46 + *(long *)(done_local + 0xe0);
      *(ulong *)(done_local + 0x138) = (ulong)local_46 + *(long *)(done_local + 0x138);
      Curl_pgrsSetUploadCounter((Curl_easy *)done_local,*(curl_off_t *)(done_local + 0xe0));
      if (*(long *)(done_local + 0xe0) < *(long *)(done_local + 0xd0)) {
        result = CURLE_NOT_BUILT_IN;
      }
      else {
        result = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    else {
      h->signature[2] = '\x19';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      result = CURLE_COULDNT_RESOLVE_PROXY;
    }
    break;
  case 5:
    result = CURLE_COULDNT_RESOLVE_HOST;
    break;
  case 6:
    result = CURLE_COULDNT_CONNECT;
    break;
  default:
    smb_pop_message((connectdata *)req);
    return CURLE_OK;
  }
  smb_pop_message((connectdata *)req);
  switch(result) {
  case CURLE_FAILED_INIT:
    msg._4_4_ = smb_send_open((Curl_easy *)done_local);
    break;
  case CURLE_URL_MALFORMAT:
    msg._4_4_ = smb_send_read((Curl_easy *)done_local);
    break;
  case CURLE_NOT_BUILT_IN:
    msg._4_4_ = smb_send_write((Curl_easy *)done_local);
    break;
  case CURLE_COULDNT_RESOLVE_PROXY:
    msg._4_4_ = smb_send_close((Curl_easy *)done_local);
    break;
  case CURLE_COULDNT_RESOLVE_HOST:
    msg._4_4_ = smb_send_tree_disconnect((Curl_easy *)done_local);
    break;
  case CURLE_COULDNT_CONNECT:
    msg._4_4_ = *(CURLcode *)(h->signature + 2);
    *(undefined1 *)&(conn->cnnct).state = CONNECT_SOCKS_INIT;
  }
  if (msg._4_4_ == CURLE_OK) {
    request_state((Curl_easy *)done_local,result);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_conncontrol((connectdata *)req,1);
    data_local._4_4_ = msg._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->set.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      smb_m = (const struct smb_nt_create_response*) msg;
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetDownloadCounter(data, data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}